

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_defined(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint in_EAX;
  char *pKey;
  SyHashEntry *pSVar1;
  uint iBool;
  ulong uStack_18;
  int nLen;
  
  uStack_18 = (ulong)in_EAX;
  if (nArg < 1) {
    jx9_context_throw_error(pCtx,3,"Missing constant name");
    iBool = 0;
  }
  else {
    pKey = jx9_value_to_string(*apArg,&nLen);
    if (nLen < 1) {
      iBool = 0;
    }
    else {
      pSVar1 = SyHashGet(&pCtx->pVm->hConstant,pKey,nLen);
      iBool = (uint)(pSVar1 != (SyHashEntry *)0x0);
    }
  }
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int vm_builtin_defined(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zName;
	int nLen = 0;
	int res = 0;
	if( nArg < 1 ){
		/* Missing constant name, return FALSE */
		jx9_context_throw_error(pCtx,JX9_CTX_NOTICE,"Missing constant name");
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Extract constant name */
	zName = jx9_value_to_string(apArg[0], &nLen);
	/* Perform the lookup */
	if( nLen > 0 && SyHashGet(&pCtx->pVm->hConstant, (const void *)zName, (sxu32)nLen) != 0 ){
		/* Already defined */
		res = 1;
	}
	jx9_result_bool(pCtx, res);
	return SXRET_OK;
}